

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O3

void ximu::PacketConstruction::
     constructWriteRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (RegisterData *data,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  unsigned_short uVar1;
  RegisterAddresses RVar2;
  uchar uVar3;
  pointer puVar4;
  initializer_list<unsigned_char> __l;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_1_ = 3;
  RVar2 = RegisterData::address(data);
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = (undefined1)(RVar2 >> 8);
  RVar2 = RegisterData::address(data);
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = (undefined1)RVar2;
  uVar1 = RegisterData::value(data);
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = (undefined1)(uVar1 >> 8);
  uVar1 = RegisterData::value(data);
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = (undefined1)uVar1;
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __l._M_len = 6;
  __l._M_array = (iterator)
                 ((long)&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,__l,
             (allocator_type *)
             ((long)&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + ~(ulong)local_40 == (pointer)0x0) {
    uVar3 = '\0';
  }
  else {
    puVar4 = (pointer)0x0;
    uVar3 = '\0';
    do {
      uVar3 = uVar3 + *(uchar *)((long)local_40 + (long)puVar4);
      puVar4 = puVar4 + 1;
    } while (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + ~(ulong)local_40 != puVar4);
  }
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[-1] = uVar3;
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_40,
             (long)decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start - (long)local_40,dest);
  if (local_40 != (undefined1  [8])0x0) {
    operator_delete((void *)local_40);
  }
  return;
}

Assistant:

static void constructWriteRegisterPacket(const RegisterData &data,
                                         OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::WRITE_REGISTER),
    static_cast<unsigned char>(static_cast<unsigned short>(
        data.address()) >> 8),
    static_cast<unsigned char>(data.address()),
    static_cast<unsigned char>(data.value() >> 8),
    static_cast<unsigned char>(data.value()),
    0 };

  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}